

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDefaultInstanceInitializer
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *this_00;
  ExtensionGenerator *this_01;
  Descriptor *pDVar1;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *this_02;
  MessageGenerator *this_03;
  int i;
  long lVar2;
  
  io::Printer::Print(printer,"$classname$::default_instance_->InitAsDefaultInstance();\n",
                     "classname",&this->classname_);
  for (lVar2 = 0; pDVar1 = this->descriptor_, lVar2 < *(int *)(pDVar1 + 0x68); lVar2 = lVar2 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar2);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::operator->
                        (this_00);
    ExtensionGenerator::GenerateRegistration(this_01,printer);
  }
  for (lVar2 = 0; lVar2 < *(int *)(pDVar1 + 0x38); lVar2 = lVar2 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator[](&this->nested_generators_,lVar2);
    this_03 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                        (this_02);
    GenerateDefaultInstanceInitializer(this_03,printer);
    pDVar1 = this->descriptor_;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateDefaultInstanceInitializer(io::Printer* printer) {
  printer->Print(
    "$classname$::default_instance_->InitAsDefaultInstance();\n",
    "classname", classname_);

  // Register extensions.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistration(printer);
  }

  // Handle nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateDefaultInstanceInitializer(printer);
  }
}